

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<unsigned_long>
          (XmlWriter *this,string *name,unsigned_long *attribute)

{
  XmlWriter *pXVar1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream oss;
  unsigned_long *attribute_local;
  string *name_local;
  XmlWriter *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::operator<<(local_198,*attribute);
  std::__cxx11::ostringstream::str();
  pXVar1 = writeAttribute(this,name,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            std::ostringstream oss;
            oss << attribute;
            return writeAttribute( name, oss.str() );
        }